

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdkanji.c
# Opt level: O0

size_t iconv(iconv_t __cd,char **__inbuf,size_t *__inbytesleft,char **__outbuf,
            size_t *__outbytesleft)

{
  size_t *outbytesleft_local;
  char **outbuf_local;
  size_t *inbytesleft_local;
  char **inbuf_local;
  iconv_t cd_local;
  
  return 0;
}

Assistant:

size_t
iconv (iconv_t cd, ICONV_CONST char **inbuf, size_t * inbytesleft,
       char **outbuf, size_t * outbytesleft)
{
	(void)cd;
	(void)inbuf;
	(void)inbytesleft;
	(void)outbuf;
	(void)outbytesleft;
	return 0;
}